

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

void __thiscall
amrex::PCInterp::interp
          (PCInterp *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,int ncomp,
          Box *fine_region,IntVect *ratio,Geometry *param_9,Geometry *param_10,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12,int param_13,
          RunOn runon)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  int in_R9D;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  Box tbx;
  Array4<double> *finearr;
  Array4<const_double> *crsearr;
  int ic;
  int i;
  int jc;
  int j;
  int kc;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_498;
  int local_494;
  int iStack_490;
  int local_48c;
  int iStack_488;
  int iStack_484;
  Array4<double> local_470;
  Array4<const_double> local_428;
  Array4<const_double> *local_3e8;
  int local_3e0;
  int local_3dc;
  long local_3d8;
  int local_3cc;
  long local_3b0;
  int local_398;
  int local_390;
  int local_388;
  int local_384;
  int local_22c;
  int local_220;
  int local_214;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_198 = *(double **)(in_RSI + 0x10);
  local_1a0 = (undefined8 *)(in_RSI + 0x18);
  local_1a4 = *(int *)(in_RSI + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(in_RSI + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(in_RSI + 0x20);
  local_f8 = (int *)(in_RSI + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = in_RSI + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(in_RSI + 0x28) + 1;
  local_118 = in_RSI + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(in_RSI + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_3e0 = in_R9D;
  local_3dc = in_R8D;
  local_3d8 = in_RCX;
  local_3cc = in_EDX;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<const_double>::Array4(&local_428,local_198,&local_1b0,&local_1d0,local_1a4);
  local_3b0 = local_3d8;
  local_a8 = *(double **)(local_3d8 + 0x10);
  local_b0 = (undefined8 *)(local_3d8 + 0x18);
  local_b4 = *(int *)(local_3d8 + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(local_3d8 + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(local_3d8 + 0x20);
  local_8 = (int *)(local_3d8 + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = local_3d8 + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(local_3d8 + 0x28) + 1;
  local_28 = local_3d8 + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(local_3d8 + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_3e8 = &local_428;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4(&local_470,local_a8,&local_c0,&local_e0,local_b4);
  iStack_488 = (int)((ulong)*(undefined8 *)((long)in_stack_00000008 + 0xc) >> 0x20);
  iStack_490 = (int)in_stack_00000008[1];
  local_48c = (int)((ulong)in_stack_00000008[1] >> 0x20);
  local_498 = (int)*in_stack_00000008;
  local_494 = (int)((ulong)*in_stack_00000008 >> 0x20);
  iStack_484 = (int)*(undefined8 *)((long)in_stack_00000008 + 0x14);
  for (local_384 = 0; local_388 = iStack_490, local_384 < local_3e0; local_384 = local_384 + 1) {
    for (; local_388 <= iStack_484; local_388 = local_388 + 1) {
      local_4b8 = in_stack_00000010[2];
      local_390 = local_494;
      if (local_4b8 == 1) {
        local_214 = local_388;
      }
      else if (local_4b8 == 2) {
        if (local_388 < 0) {
          iVar1 = local_388 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_4b0 = -iVar1 / 2 + -1;
        }
        else {
          local_4b0 = local_388 / 2;
        }
        local_214 = local_4b0;
      }
      else if (local_4b8 == 4) {
        if (local_388 < 0) {
          iVar1 = local_388 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_4b4 = -iVar1 / 4 + -1;
        }
        else {
          local_4b4 = local_388 / 4;
        }
        local_214 = local_4b4;
      }
      else {
        if (local_388 < 0) {
          iVar1 = local_388 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_4b8 = -iVar1 / local_4b8 + -1;
        }
        else {
          local_4b8 = local_388 / local_4b8;
        }
        local_214 = local_4b8;
      }
      for (; local_390 <= iStack_488; local_390 = local_390 + 1) {
        local_4c8 = in_stack_00000010[1];
        local_398 = local_498;
        if (local_4c8 == 1) {
          local_220 = local_390;
        }
        else if (local_4c8 == 2) {
          if (local_390 < 0) {
            iVar1 = local_390 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_4c0 = -iVar1 / 2 + -1;
          }
          else {
            local_4c0 = local_390 / 2;
          }
          local_220 = local_4c0;
        }
        else if (local_4c8 == 4) {
          if (local_390 < 0) {
            iVar1 = local_390 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_4c4 = -iVar1 / 4 + -1;
          }
          else {
            local_4c4 = local_390 / 4;
          }
          local_220 = local_4c4;
        }
        else {
          if (local_390 < 0) {
            iVar1 = local_390 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_4c8 = -iVar1 / local_4c8 + -1;
          }
          else {
            local_4c8 = local_390 / local_4c8;
          }
          local_220 = local_4c8;
        }
        for (; local_398 <= local_48c; local_398 = local_398 + 1) {
          local_4d8 = *in_stack_00000010;
          if (local_4d8 == 1) {
            local_22c = local_398;
          }
          else if (local_4d8 == 2) {
            if (local_398 < 0) {
              iVar1 = local_398 + 1;
              if (iVar1 < 1) {
                iVar1 = -iVar1;
              }
              local_4d0 = -iVar1 / 2 + -1;
            }
            else {
              local_4d0 = local_398 / 2;
            }
            local_22c = local_4d0;
          }
          else if (local_4d8 == 4) {
            if (local_398 < 0) {
              iVar1 = local_398 + 1;
              if (iVar1 < 1) {
                iVar1 = -iVar1;
              }
              local_4d4 = -iVar1 / 4 + -1;
            }
            else {
              local_4d4 = local_398 / 4;
            }
            local_22c = local_4d4;
          }
          else {
            if (local_398 < 0) {
              iVar1 = local_398 + 1;
              if (iVar1 < 1) {
                iVar1 = -iVar1;
              }
              local_4d8 = -iVar1 / local_4d8 + -1;
            }
            else {
              local_4d8 = local_398 / local_4d8;
            }
            local_22c = local_4d8;
          }
          local_470.p
          [(long)(local_398 - local_470.begin.x) +
           (local_390 - local_470.begin.y) * local_470.jstride +
           (local_388 - local_470.begin.z) * local_470.kstride +
           (local_384 + local_3dc) * local_470.nstride] =
               local_3e8->p
               [(long)(local_22c - (local_3e8->begin).x) +
                (long)(local_220 - (local_3e8->begin).y) * local_3e8->jstride +
                (long)(local_214 - (local_3e8->begin).z) * local_3e8->kstride +
                (long)(local_384 + local_3cc) * local_3e8->nstride];
        }
      }
    }
  }
  return;
}

Assistant:

void
PCInterp::interp (const FArrayBox& crse,
                  int              crse_comp,
                  FArrayBox&       fine,
                  int              fine_comp,
                  int              ncomp,
                  const Box&       fine_region,
                  const IntVect&   ratio,
                  const Geometry& /*crse_geom*/,
                  const Geometry& /*fine_geom*/,
                  Vector<BCRec> const& /*bcr*/,
                  int               /*actual_comp*/,
                  int               /*actual_state*/,
                  RunOn             runon)
{
    BL_PROFILE("PCInterp::interp()");

    Array4<Real const> const& crsearr = crse.const_array();
    Array4<Real> const& finearr = fine.array();;

    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG ( runon, fine_region, tbx,
    {
        amrex::pcinterp_interp(tbx,finearr,fine_comp,ncomp,crsearr,crse_comp,ratio);
    });
}